

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_post_effects.cpp
# Opt level: O1

bool __thiscall
ON_PostEffects::GetSelectedPostEffect(ON_PostEffects *this,Types type,ON_UUID *id_out)

{
  int iVar1;
  ON_XMLNode *pOVar2;
  undefined4 extraout_var;
  long *plVar3;
  ON_UUID OVar4;
  
  pOVar2 = CImpl::PostEffectsNode(this->_impl);
  pOVar2 = GetPostEffectTypeNode(pOVar2,type);
  if (pOVar2 != (ON_XMLNode *)0x0) {
    iVar1 = (*pOVar2->_vptr_ON_XMLNode[0x26])(pOVar2,L"selection");
    plVar3 = (long *)CONCAT44(extraout_var,iVar1);
    if (plVar3 != (long *)0x0) {
      plVar3 = (long *)(**(code **)(*plVar3 + 0x38))(plVar3);
      OVar4 = (ON_UUID)(**(code **)(*plVar3 + 0x138))(plVar3);
      *id_out = OVar4;
      return true;
    }
  }
  return false;
}

Assistant:

bool ON_PostEffects::GetSelectedPostEffect(ON_PostEffect::Types type, ON_UUID& id_out) const
{
  const ON_XMLNode* pep_type_node = GetPostEffectTypeNode(_impl->PostEffectsNode(), type);
  if (nullptr != pep_type_node)
  {
    ON_XMLProperty* prop = pep_type_node->GetNamedProperty(ON_RDK_PEP_SELECTION);
    if (nullptr != prop)
    {
      id_out = prop->GetValue().AsUuid();
      return true;
    }
  }

  return false;
}